

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::RenderPieSlice
               (ImDrawList *DrawList,ImPlotPoint *center,double radius,double a0,double a1,ImU32 col
               )

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  ImVec2 *local_78;
  double a;
  int i;
  double da;
  int n;
  ImU32 col_local;
  double a1_local;
  double a0_local;
  double radius_local;
  ImPlotPoint *center_local;
  ImDrawList *DrawList_local;
  
  if (RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::buffer ==
      '\0') {
    iVar3 = __cxa_guard_acquire(&RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)
                                 ::buffer);
    if (iVar3 != 0) {
      local_78 = RenderPieSlice::buffer;
      do {
        ImVec2::ImVec2(local_78);
        local_78 = local_78 + 1;
      } while (local_78 !=
               (ImVec2 *)
               &RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)::
                buffer);
      __cxa_guard_release(&RenderPieSlice(ImDrawList&,ImPlotPoint_const&,double,double,double,unsigned_int)
                           ::buffer);
    }
  }
  RenderPieSlice::buffer[0] = PlotToPixels(center,-1);
  iVar3 = ImMax<int>(3,(int)((a1 - a0) * 7.957746982574463));
  for (a._4_4_ = 0; a._4_4_ < iVar3; a._4_4_ = a._4_4_ + 1) {
    dVar4 = (double)a._4_4_ * ((a1 - a0) / (double)(iVar3 + -1)) + a0;
    dVar1 = center->x;
    dVar5 = cos(dVar4);
    dVar2 = center->y;
    dVar4 = sin(dVar4);
    IVar6 = PlotToPixels(radius * dVar5 + dVar1,radius * dVar4 + dVar2,-1);
    RenderPieSlice::buffer[a._4_4_ + 1] = IVar6;
  }
  ImDrawList::AddConvexPolyFilled(DrawList,RenderPieSlice::buffer,iVar3 + 1,col);
  return;
}

Assistant:

inline void RenderPieSlice(ImDrawList& DrawList, const ImPlotPoint& center, double radius, double a0, double a1, ImU32 col) {
    static const float resolution = 50 / (2 * IM_PI);
    static ImVec2 buffer[50];
    buffer[0] = PlotToPixels(center);
    int n = ImMax(3, (int)((a1 - a0) * resolution));
    double da = (a1 - a0) / (n - 1);
    for (int i = 0; i < n; ++i) {
        double a = a0 + i * da;
        buffer[i + 1] = PlotToPixels(center.x + radius * cos(a), center.y + radius * sin(a));
    }
    DrawList.AddConvexPolyFilled(buffer, n + 1, col);
}